

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_util.cpp
# Opt level: O2

EnumStringLiteral * duckdb::GetMultiFileFileStateValues(void)

{
  return GetMultiFileFileStateValues::values;
}

Assistant:

const StringUtil::EnumStringLiteral *GetMultiFileFileStateValues() {
	static constexpr StringUtil::EnumStringLiteral values[] {
		{ static_cast<uint32_t>(MultiFileFileState::UNOPENED), "UNOPENED" },
		{ static_cast<uint32_t>(MultiFileFileState::OPENING), "OPENING" },
		{ static_cast<uint32_t>(MultiFileFileState::OPEN), "OPEN" },
		{ static_cast<uint32_t>(MultiFileFileState::SKIPPED), "SKIPPED" },
		{ static_cast<uint32_t>(MultiFileFileState::CLOSED), "CLOSED" }
	};
	return values;
}